

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

void compile_backtrackingpath(compiler_common *common,backtrack_common *current)

{
  sljit_compiler *compiler_00;
  then_trap_backtrack *ptVar1;
  jump_list *list;
  int iVar2;
  sljit_label *label;
  sljit_jump *psVar3;
  sljit_label *psVar4;
  then_trap_backtrack *save_then_trap;
  sljit_compiler *compiler;
  backtrack_common *current_local;
  compiler_common *common_local;
  
  compiler_00 = common->compiler;
  ptVar1 = common->then_trap;
  for (compiler = (sljit_compiler *)current; compiler != (sljit_compiler *)0x0;
      compiler = *(sljit_compiler **)compiler) {
    if (compiler->labels != (sljit_label *)0x0) {
      psVar4 = compiler->labels;
      label = sljit_emit_label(compiler_00);
      set_jumps((jump_list *)psVar4,label);
    }
    switch(*(undefined2 *)&compiler->last_label->next) {
    case 3:
      sljit_emit_op1(compiler_00,0x20,1,0,0x8c,0);
      free_stack(common,1);
      sljit_emit_op1(compiler_00,0x20,0x8e,(long)common->ovector_start,1,0);
      break;
    default:
      break;
    case 0x21:
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x2f:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
    case 0x3a:
    case 0x3b:
    case 0x3c:
    case 0x3d:
    case 0x3e:
    case 0x3f:
    case 0x40:
    case 0x41:
    case 0x42:
    case 0x43:
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4c:
    case 0x4d:
    case 0x4e:
    case 0x4f:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x53:
    case 0x54:
    case 0x55:
    case 0x56:
    case 0x57:
    case 0x58:
    case 0x59:
    case 0x5a:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x5f:
    case 0x60:
    case 0x61:
    case 0x6e:
    case 0x6f:
    case 0x70:
      compile_iterator_backtrackingpath(common,(backtrack_common *)compiler);
      break;
    case 0x71:
    case 0x72:
    case 0x73:
    case 0x74:
      compile_ref_iterator_backtrackingpath(common,(backtrack_common *)compiler);
      break;
    case 0x75:
      compile_recurse_backtrackingpath(common,(backtrack_common *)compiler);
      break;
    case 0x76:
    case 0x77:
    case 0x9f:
    case 0xa0:
    case 0xa1:
      list = (jump_list *)compiler->consts;
      psVar4 = sljit_emit_label(compiler_00);
      set_jumps(list,psVar4);
      break;
    case 0x7e:
    case 0x7f:
    case 0x80:
    case 0x81:
      compile_assert_backtrackingpath(common,(backtrack_common *)compiler);
      break;
    case 0x82:
    case 0x83:
    case 0x85:
    case 0x87:
    case 0x88:
    case 0x8a:
    case 0x8c:
      compile_bracket_backtrackingpath(common,(backtrack_common *)compiler);
      break;
    case 0x84:
    case 0x86:
    case 0x89:
    case 0x8b:
    case 0x95:
      compile_bracketpos_backtrackingpath(common,(backtrack_common *)compiler);
      break;
    case 0x93:
      if (*(ushort *)((long)&compiler->last_label->next + 2) < 0x82) {
        compile_assert_backtrackingpath(common,(backtrack_common *)compiler);
      }
      else {
        compile_bracket_backtrackingpath(common,(backtrack_common *)compiler);
      }
      break;
    case 0x94:
      compile_braminzero_backtrackingpath(common,(backtrack_common *)compiler);
      break;
    case 0x96:
      iVar2 = 0;
      if (common->has_skip_arg != 0) {
        iVar2 = 4;
      }
      sljit_emit_op1(compiler_00,0x20,1,0,0x8c,(long)(iVar2 << 3));
      if (common->has_skip_arg != 0) {
        sljit_emit_op1(compiler_00,0x20,4,0,0x8c,0);
      }
      iVar2 = 1;
      if (common->has_skip_arg != 0) {
        iVar2 = 5;
      }
      free_stack(common,iVar2);
      sljit_emit_op1(compiler_00,0x20,0x8e,(long)common->mark_ptr,1,0);
      if (common->has_skip_arg != 0) {
        sljit_emit_op1(compiler_00,0x20,0x8e,(long)common->control_head_ptr,4,0);
      }
      break;
    case 0x97:
    case 0x98:
    case 0x99:
    case 0x9a:
    case 0x9b:
    case 0x9c:
      compile_control_verb_backtrackingpath(common,(backtrack_common *)compiler);
      break;
    case 0x9d:
    case 0x9e:
      if (common->local_quit_available == 0) {
        sljit_emit_op1(compiler_00,0x20,1,0,0x40,-1);
      }
      if (common->quit_label == (sljit_label *)0x0) {
        psVar3 = sljit_emit_jump(compiler_00,0x18);
        add_jump(compiler_00,&common->quit,psVar3);
      }
      else {
        psVar3 = sljit_emit_jump(compiler_00,0x18);
        sljit_set_label(psVar3,common->quit_label);
      }
      break;
    case 0xa5:
      compile_then_trap_backtrackingpath(common,(backtrack_common *)compiler);
    }
  }
  common->then_trap = ptVar1;
  return;
}

Assistant:

static void compile_backtrackingpath(compiler_common *common, struct backtrack_common *current)
{
DEFINE_COMPILER;
then_trap_backtrack *save_then_trap = common->then_trap;

while (current)
  {
  if (current->nextbacktracks != NULL)
    set_jumps(current->nextbacktracks, LABEL());
  switch(*current->cc)
    {
    case OP_SET_SOM:
    OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(STACK_TOP), STACK(0));
    free_stack(common, 1);
    OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), OVECTOR(0), TMP1, 0);
    break;

    case OP_STAR:
    case OP_MINSTAR:
    case OP_PLUS:
    case OP_MINPLUS:
    case OP_QUERY:
    case OP_MINQUERY:
    case OP_UPTO:
    case OP_MINUPTO:
    case OP_EXACT:
    case OP_POSSTAR:
    case OP_POSPLUS:
    case OP_POSQUERY:
    case OP_POSUPTO:
    case OP_STARI:
    case OP_MINSTARI:
    case OP_PLUSI:
    case OP_MINPLUSI:
    case OP_QUERYI:
    case OP_MINQUERYI:
    case OP_UPTOI:
    case OP_MINUPTOI:
    case OP_EXACTI:
    case OP_POSSTARI:
    case OP_POSPLUSI:
    case OP_POSQUERYI:
    case OP_POSUPTOI:
    case OP_NOTSTAR:
    case OP_NOTMINSTAR:
    case OP_NOTPLUS:
    case OP_NOTMINPLUS:
    case OP_NOTQUERY:
    case OP_NOTMINQUERY:
    case OP_NOTUPTO:
    case OP_NOTMINUPTO:
    case OP_NOTEXACT:
    case OP_NOTPOSSTAR:
    case OP_NOTPOSPLUS:
    case OP_NOTPOSQUERY:
    case OP_NOTPOSUPTO:
    case OP_NOTSTARI:
    case OP_NOTMINSTARI:
    case OP_NOTPLUSI:
    case OP_NOTMINPLUSI:
    case OP_NOTQUERYI:
    case OP_NOTMINQUERYI:
    case OP_NOTUPTOI:
    case OP_NOTMINUPTOI:
    case OP_NOTEXACTI:
    case OP_NOTPOSSTARI:
    case OP_NOTPOSPLUSI:
    case OP_NOTPOSQUERYI:
    case OP_NOTPOSUPTOI:
    case OP_TYPESTAR:
    case OP_TYPEMINSTAR:
    case OP_TYPEPLUS:
    case OP_TYPEMINPLUS:
    case OP_TYPEQUERY:
    case OP_TYPEMINQUERY:
    case OP_TYPEUPTO:
    case OP_TYPEMINUPTO:
    case OP_TYPEEXACT:
    case OP_TYPEPOSSTAR:
    case OP_TYPEPOSPLUS:
    case OP_TYPEPOSQUERY:
    case OP_TYPEPOSUPTO:
    case OP_CLASS:
    case OP_NCLASS:
#if defined SUPPORT_UNICODE || PCRE2_CODE_UNIT_WIDTH != 8
    case OP_XCLASS:
#endif
    compile_iterator_backtrackingpath(common, current);
    break;

    case OP_REF:
    case OP_REFI:
    case OP_DNREF:
    case OP_DNREFI:
    compile_ref_iterator_backtrackingpath(common, current);
    break;

    case OP_RECURSE:
    compile_recurse_backtrackingpath(common, current);
    break;

    case OP_ASSERT:
    case OP_ASSERT_NOT:
    case OP_ASSERTBACK:
    case OP_ASSERTBACK_NOT:
    compile_assert_backtrackingpath(common, current);
    break;

    case OP_ONCE:
    case OP_BRA:
    case OP_CBRA:
    case OP_COND:
    case OP_SBRA:
    case OP_SCBRA:
    case OP_SCOND:
    compile_bracket_backtrackingpath(common, current);
    break;

    case OP_BRAZERO:
    if (current->cc[1] > OP_ASSERTBACK_NOT)
      compile_bracket_backtrackingpath(common, current);
    else
      compile_assert_backtrackingpath(common, current);
    break;

    case OP_BRAPOS:
    case OP_CBRAPOS:
    case OP_SBRAPOS:
    case OP_SCBRAPOS:
    case OP_BRAPOSZERO:
    compile_bracketpos_backtrackingpath(common, current);
    break;

    case OP_BRAMINZERO:
    compile_braminzero_backtrackingpath(common, current);
    break;

    case OP_MARK:
    OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(STACK_TOP), STACK(common->has_skip_arg ? 4 : 0));
    if (common->has_skip_arg)
      OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(STACK_TOP), STACK(0));
    free_stack(common, common->has_skip_arg ? 5 : 1);
    OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), common->mark_ptr, TMP1, 0);
    if (common->has_skip_arg)
      OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), common->control_head_ptr, TMP2, 0);
    break;

    case OP_THEN:
    case OP_THEN_ARG:
    case OP_PRUNE:
    case OP_PRUNE_ARG:
    case OP_SKIP:
    case OP_SKIP_ARG:
    compile_control_verb_backtrackingpath(common, current);
    break;

    case OP_COMMIT:
    case OP_COMMIT_ARG:
    if (!common->local_quit_available)
      OP1(SLJIT_MOV, SLJIT_RETURN_REG, 0, SLJIT_IMM, PCRE2_ERROR_NOMATCH);
    if (common->quit_label == NULL)
      add_jump(compiler, &common->quit, JUMP(SLJIT_JUMP));
    else
      JUMPTO(SLJIT_JUMP, common->quit_label);
    break;

    case OP_CALLOUT:
    case OP_CALLOUT_STR:
    case OP_FAIL:
    case OP_ACCEPT:
    case OP_ASSERT_ACCEPT:
    set_jumps(current->topbacktracks, LABEL());
    break;

    case OP_THEN_TRAP:
    /* A virtual opcode for then traps. */
    compile_then_trap_backtrackingpath(common, current);
    break;

    default:
    SLJIT_UNREACHABLE();
    break;
    }
  current = current->prev;
  }
common->then_trap = save_then_trap;
}